

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_struct_hashcode
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  reference pptVar5;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  t_type *local_b8;
  t_type *ttype;
  t_field **local_a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_a0;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_40);
  poVar4 = std::operator<<(poVar4,"public override int GetHashCode() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"int hashcode = 157;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&fields);
  poVar4 = std::operator<<(poVar4,"unchecked {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_a0);
  local_a8 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_a0._M_current = local_a8;
  while( true ) {
    ttype = (t_type *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&ttype);
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_a0);
    local_b8 = t_field::get_type(*pptVar5);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_a0);
    generate_null_check_begin(this,(ostream *)ptVar1,*pptVar5);
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_d8);
    std::operator<<(poVar4,"hashcode = (hashcode * 397) + ");
    std::__cxx11::string::~string((string *)&local_d8);
    uVar3 = (*(local_b8->super_t_doc)._vptr_t_doc[0xd])();
    ptVar1 = tstruct_local;
    if ((uVar3 & 1) == 0) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_a0);
      prop_name_abi_cxx11_(&local_118,this,*pptVar5,false);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_118);
      std::operator<<(poVar4,".GetHashCode()");
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      poVar4 = std::operator<<((ostream *)tstruct_local,"TCollections.GetHashCode(");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_a0);
      prop_name_abi_cxx11_(&local_f8,this,*pptVar5,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_f8);
      std::operator<<(poVar4,")");
      std::__cxx11::string::~string((string *)&local_f8);
    }
    poVar4 = std::operator<<((ostream *)tstruct_local,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_a0);
    generate_null_check_end(this,(ostream *)ptVar1,*pptVar5);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_a0);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_138);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"return hashcode;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_178);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_hashcode(ostream& out, t_struct* tstruct)
{
    out << indent() << "public override int GetHashCode() {" << endl;
    indent_up();

    out << indent() << "int hashcode = 157;" << endl;
    out << indent() << "unchecked {" << endl;
    indent_up();

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        t_type* ttype = (*f_iter)->get_type();

        generate_null_check_begin(out, *f_iter);
        out << indent() << "hashcode = (hashcode * 397) + ";
        if (ttype->is_container()) {
            out << "TCollections.GetHashCode(" << prop_name((*f_iter)) << ")";
        }
        else {
            out << prop_name((*f_iter)) << ".GetHashCode()";
        }
        out << ";" << endl;

        generate_null_check_end(out, *f_iter);
    }

    indent_down();
    out << indent() << "}" << endl;
    out << indent() << "return hashcode;" << endl;

    indent_down();
    out << indent() << "}" << endl << endl;
}